

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSampleVariableTests.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::anon_unknown_2::SampleMaskUniqueSetCase::postTest
          (SampleMaskUniqueSetCase *this)

{
  ostringstream *poVar1;
  ostringstream *this_00;
  uint uVar2;
  uint uVar3;
  pointer pSVar4;
  TestLog *log;
  byte bVar5;
  undefined4 uVar6;
  long lVar7;
  long lVar8;
  bool bVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  _Base_ptr p_Var13;
  bool bVar14;
  int y;
  int iVar15;
  int iVar16;
  long lVar17;
  Hex<8UL> hex;
  long lVar18;
  Hex<8UL> hex_00;
  Hex<8UL> hex_01;
  int iVar19;
  Hex<8UL> hex_02;
  int maskNdx;
  long lVar20;
  _Rb_tree_header *p_Var21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  int local_264;
  deUint32 mask;
  long local_220;
  long local_218;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> masks;
  vector<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_> sampleCoverage;
  ScopedLogSection section;
  undefined1 local_1c0 [16];
  MessageBuilder local_1b0;
  
  pSVar4 = (this->m_iterationSampleBuffers).
           super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_218 = CONCAT44(local_218._4_4_,pSVar4->m_width);
  local_220 = CONCAT44(local_220._4_4_,pSVar4->m_height);
  std::vector<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_>::vector
            (&sampleCoverage,
             (long)(this->super_SampleMaskBaseCase).super_MultisampleRenderCase.
                   super_MultisampleRenderCase.m_numTargetSamples,(allocator_type *)&local_1b0);
  log = ((this->super_SampleMaskBaseCase).super_MultisampleRenderCase.super_MultisampleRenderCase.
         super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b0,"Verify",(allocator<char> *)local_1c0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&masks,"Verify masks",(allocator<char> *)&mask);
  tcu::ScopedLogSection::ScopedLogSection(&section,log,(string *)&local_1b0,(string *)&masks);
  std::__cxx11::string::~string((string *)&masks);
  std::__cxx11::string::~string((string *)&local_1b0);
  lVar18 = 0;
  iVar10 = 0;
  if (0 < (int)local_218) {
    iVar10 = (int)local_218;
  }
  iVar11 = 0;
  if (0 < (int)local_220) {
    iVar11 = (int)local_220;
  }
  for (; lVar18 < (int)(((long)sampleCoverage.
                               super__Vector_base<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)sampleCoverage.
                              super__Vector_base<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_>
                              ._M_impl.super__Vector_impl_data._M_start) / 0x28);
      lVar18 = lVar18 + 1) {
    local_1b0.m_log = (TestLog *)0x2100000000;
    tcu::TextureLevel::setStorage
              (sampleCoverage.
               super__Vector_base<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_>._M_impl.
               super__Vector_impl_data._M_start + lVar18,(TextureFormat *)&local_1b0,(int)local_218,
               (int)local_220,1);
    for (iVar15 = 0; iVar15 != iVar11; iVar15 = iVar15 + 1) {
      for (iVar19 = 0; iVar10 != iVar19; iVar19 = iVar19 + 1) {
        pSVar4 = (this->m_iterationSampleBuffers).
                 super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar2 = *(uint *)((long)pSVar4[lVar18].m_pixels.m_ptr +
                         (long)(pSVar4[lVar18].m_width * iVar15 + iVar19) * 4);
        iVar12 = (int)(((long)sampleCoverage.
                              super__Vector_base<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)sampleCoverage.
                             super__Vector_base<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_>
                             ._M_impl.super__Vector_impl_data._M_start) / 0x28) + (int)lVar18;
        uVar3 = *(uint *)((long)pSVar4[iVar12].m_pixels.m_ptr +
                         (long)(pSVar4[iVar12].m_width * iVar15 + iVar19) * 4);
        tcu::TextureLevel::getAccess
                  ((PixelBufferAccess *)&local_1b0,
                   sampleCoverage.
                   super__Vector_base<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_>._M_impl
                   .super__Vector_impl_data._M_start + lVar18);
        fVar22 = floorf(((float)(uVar3 >> 0x10 & 0xff) / 255.0) * 31.0 + 0.5);
        fVar23 = floorf(((float)(uVar3 >> 8 & 0xff) / 255.0) * 63.0 + 0.5);
        fVar24 = floorf(((float)(uVar3 & 0xff) / 255.0) * 31.0 + 0.5);
        fVar25 = floorf(((float)(uVar2 >> 8 & 0xff) / 255.0) * 63.0 + 0.5);
        fVar26 = floorf(((float)(uVar2 & 0xff) / 255.0) * 31.0 + 0.5);
        fVar27 = floorf(((float)(uVar2 >> 0x10 & 0xff) / 255.0) * 31.0 + 0.5);
        masks._M_t._M_impl._0_4_ =
             ((int)fVar27 << 0xb | (int)fVar26 | (int)fVar25 << 5) & 0xffffU | (int)fVar24 << 0x10 |
             (int)fVar23 << 0x15 | (int)fVar22 << 0x1b;
        masks._M_t._M_impl._4_4_ = 0;
        masks._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        masks._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
        tcu::PixelBufferAccess::setPixel
                  ((PixelBufferAccess *)&local_1b0,(UVec4 *)&masks,iVar19,iVar15,0);
      }
    }
  }
  if ((this->super_SampleMaskBaseCase).super_MultisampleRenderCase.super_MultisampleRenderCase.
      m_numRequestedSamples == 0) {
    local_1b0.m_log =
         ((this->super_SampleMaskBaseCase).super_MultisampleRenderCase.super_MultisampleRenderCase.
          super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = &local_1b0.m_str;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
    std::operator<<((ostream *)poVar1,"Verifying sample mask is 0x00000001.");
    tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
    bVar14 = true;
    poVar1 = &local_1b0.m_str;
    iVar15 = 0;
    for (iVar19 = 0; iVar19 != iVar11; iVar19 = iVar19 + 1) {
      for (iVar12 = 0; iVar10 != iVar12; iVar12 = iVar12 + 1) {
        tcu::TextureLevel::getAccess
                  ((PixelBufferAccess *)&local_1b0,
                   sampleCoverage.
                   super__Vector_base<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_>._M_impl
                   .super__Vector_impl_data._M_start);
        tcu::ConstPixelBufferAccess::getPixelUint
                  ((ConstPixelBufferAccess *)&masks,(int)&local_1b0,iVar12,iVar19);
        hex_01.value._4_4_ = 0;
        hex_01.value._0_4_ = masks._M_t._M_impl._0_4_;
        if (hex_01.value != 1) {
          iVar15 = iVar15 + 1;
          if (iVar15 < 6) {
            local_1b0.m_log =
                 ((this->super_SampleMaskBaseCase).super_MultisampleRenderCase.
                  super_MultisampleRenderCase.super_TestCase.super_TestCase.super_TestNode.m_testCtx
                 )->m_log;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
            std::operator<<((ostream *)poVar1,"Pixel (");
            std::ostream::operator<<(poVar1,iVar12);
            std::operator<<((ostream *)poVar1,", ");
            std::ostream::operator<<(poVar1,iVar19);
            std::operator<<((ostream *)poVar1,"): Invalid mask, got ");
            tcu::Format::operator<<((ostream *)poVar1,hex_01);
            std::operator<<((ostream *)poVar1,", expected ");
            tcu::Format::operator<<((ostream *)poVar1,(Hex<8UL>)0x1);
            std::operator<<((ostream *)poVar1,"\n");
            tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage)
            ;
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
          }
          bVar14 = false;
        }
      }
    }
    if (iVar15 < 6 || bVar14) goto LAB_004366cc;
    local_1b0.m_log =
         ((this->super_SampleMaskBaseCase).super_MultisampleRenderCase.super_MultisampleRenderCase.
          super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = &local_1b0.m_str;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
    std::operator<<((ostream *)poVar1,"...\n");
    std::operator<<((ostream *)poVar1,"Omitted ");
    std::ostream::operator<<(poVar1,iVar15 + -5);
    std::operator<<((ostream *)poVar1," error descriptions.");
    tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
LAB_0043674a:
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1b0.m_str);
  }
  else {
    local_1b0.m_log =
         ((this->super_SampleMaskBaseCase).super_MultisampleRenderCase.super_MultisampleRenderCase.
          super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = &local_1b0.m_str;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
    std::operator<<((ostream *)poVar1,"Verifying invocation sample masks do not share bits.");
    tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
    bVar14 = true;
    poVar1 = &local_1b0.m_str;
    iVar15 = 0;
    for (iVar19 = 0; iVar19 != iVar11; iVar19 = iVar19 + 1) {
      for (iVar12 = 0; iVar12 != iVar10; iVar12 = iVar12 + 1) {
        iVar16 = (this->super_SampleMaskBaseCase).super_MultisampleRenderCase.
                 super_MultisampleRenderCase.m_numTargetSamples;
        lVar17 = 0;
        lVar18 = 1;
        lVar20 = 0x28;
        bVar5 = 0;
        while ((lVar17 < iVar16 && (lVar7 = lVar20, lVar8 = lVar18, !(bool)(4 < iVar15 & bVar5)))) {
          while ((local_218 = lVar8, local_220 = lVar7, lVar18 < iVar16 &&
                 (!(bool)(4 < iVar15 & bVar5)))) {
            tcu::TextureLevel::getAccess
                      ((PixelBufferAccess *)&local_1b0,
                       sampleCoverage.
                       super__Vector_base<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_>.
                       _M_impl.super__Vector_impl_data._M_start + lVar17);
            iVar16 = (int)&local_1b0;
            tcu::ConstPixelBufferAccess::getPixelUint
                      ((ConstPixelBufferAccess *)&masks,iVar16,iVar12,iVar19);
            uVar6 = masks._M_t._M_impl._0_4_;
            hex_00.value._4_4_ = 0;
            hex_00.value._0_4_ = masks._M_t._M_impl._0_4_;
            tcu::TextureLevel::getAccess
                      ((PixelBufferAccess *)&local_1b0,
                       (TextureLevel *)
                       ((long)((sampleCoverage.
                                super__Vector_base<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_>
                                ._M_impl.super__Vector_impl_data._M_start)->m_size).m_data +
                       lVar20 + -8));
            tcu::ConstPixelBufferAccess::getPixelUint
                      ((ConstPixelBufferAccess *)&masks,iVar16,iVar12,iVar19);
            hex_02.value._4_4_ = 0;
            hex_02.value._0_4_ = masks._M_t._M_impl._0_4_;
            if ((masks._M_t._M_impl._0_4_ & uVar6) != 0 && uVar6 != masks._M_t._M_impl._0_4_) {
              iVar15 = iVar15 + 1;
              bVar5 = 1;
              if (iVar15 < 6) {
                local_1b0.m_log =
                     ((this->super_SampleMaskBaseCase).super_MultisampleRenderCase.
                      super_MultisampleRenderCase.super_TestCase.super_TestCase.super_TestNode.
                     m_testCtx)->m_log;
                std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
                std::operator<<((ostream *)poVar1,"Pixel (");
                std::ostream::operator<<(poVar1,iVar12);
                std::operator<<((ostream *)poVar1,", ");
                std::ostream::operator<<(poVar1,iVar19);
                std::operator<<((ostream *)poVar1,"):\n");
                std::operator<<((ostream *)poVar1,"\tSamples ");
                std::ostream::operator<<(poVar1,(int)lVar17);
                std::operator<<((ostream *)poVar1," and ");
                std::ostream::operator<<(poVar1,(int)lVar18);
                std::operator<<((ostream *)poVar1," share mask bits\n");
                std::operator<<((ostream *)poVar1,"\tMask");
                std::ostream::operator<<(poVar1,(int)lVar17);
                std::operator<<((ostream *)poVar1," = ");
                tcu::Format::operator<<((ostream *)poVar1,hex_00);
                std::operator<<((ostream *)poVar1,"\n");
                std::operator<<((ostream *)poVar1,"\tMask");
                std::ostream::operator<<(poVar1,(int)lVar18);
                std::operator<<((ostream *)poVar1," = ");
                tcu::Format::operator<<((ostream *)poVar1,hex_02);
                std::operator<<((ostream *)poVar1,"\n");
                tcu::MessageBuilder::operator<<
                          (&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
              }
              bVar14 = false;
            }
            iVar16 = (this->super_SampleMaskBaseCase).super_MultisampleRenderCase.
                     super_MultisampleRenderCase.m_numTargetSamples;
            lVar20 = lVar20 + 0x28;
            lVar18 = lVar18 + 1;
            lVar7 = local_220;
            lVar8 = local_218;
          }
          lVar17 = lVar17 + 1;
          lVar20 = local_220 + 0x28;
          lVar18 = local_218 + 1;
        }
      }
    }
    if (5 < iVar15 && !bVar14) {
      local_1b0.m_log =
           ((this->super_SampleMaskBaseCase).super_MultisampleRenderCase.super_MultisampleRenderCase
            .super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log;
      poVar1 = &local_1b0.m_str;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
      std::operator<<((ostream *)poVar1,"...\n");
      std::operator<<((ostream *)poVar1,"Omitted ");
      std::ostream::operator<<(poVar1,iVar15 + -5);
      std::operator<<((ostream *)poVar1," error descriptions.");
      tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
    }
    iVar19 = ((this->super_SampleMaskBaseCase).super_MultisampleRenderCase.
              super_MultisampleRenderCase.m_numTargetSamples + 1) / 2;
    iVar15 = 1;
    if (1 < iVar19) {
      iVar15 = iVar19;
    }
    local_1b0.m_log =
         ((this->super_SampleMaskBaseCase).super_MultisampleRenderCase.super_MultisampleRenderCase.
          super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = &local_1b0.m_str;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
    std::operator<<((ostream *)poVar1,
                    "Verifying cardinality of separate sample mask bit sets. Expecting equal to the number of invocations, (greater or equal to "
                   );
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::operator<<((ostream *)poVar1,")");
    tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
    bVar9 = true;
    poVar1 = &local_1b0.m_str;
    local_264 = 0;
    for (iVar19 = 0; iVar19 != iVar11; iVar19 = iVar19 + 1) {
      for (iVar12 = 0; p_Var21 = &masks._M_t._M_impl.super__Rb_tree_header, iVar12 != iVar10;
          iVar12 = iVar12 + 1) {
        masks._M_t._M_impl._4_8_ = masks._M_t._M_impl._4_8_ & 0xffffffff;
        masks._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        masks._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        lVar18 = 0;
        lVar20 = 0;
        masks._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var21->_M_header;
        masks._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var21->_M_header;
        for (; lVar20 < (this->super_SampleMaskBaseCase).super_MultisampleRenderCase.
                        super_MultisampleRenderCase.m_numTargetSamples; lVar20 = lVar20 + 1) {
          tcu::TextureLevel::getAccess
                    ((PixelBufferAccess *)&local_1b0,
                     (TextureLevel *)
                     ((long)((sampleCoverage.
                              super__Vector_base<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_>
                              ._M_impl.super__Vector_impl_data._M_start)->m_size).m_data +
                     lVar18 + -8));
          tcu::ConstPixelBufferAccess::getPixelUint
                    ((ConstPixelBufferAccess *)local_1c0,(int)&local_1b0,iVar12,iVar19);
          mask = local_1c0._0_4_;
          std::
          _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
          ::_M_insert_unique<unsigned_int_const&>
                    ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                      *)&masks,&mask);
          lVar18 = lVar18 + 0x28;
        }
        if ((int)masks._M_t._M_impl.super__Rb_tree_header._M_node_count < iVar15) {
          local_264 = local_264 + 1;
          this_00 = &local_1b0.m_str;
          if (local_264 < 6) {
            local_1b0.m_log =
                 ((this->super_SampleMaskBaseCase).super_MultisampleRenderCase.
                  super_MultisampleRenderCase.super_TestCase.super_TestCase.super_TestNode.m_testCtx
                 )->m_log;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
            std::operator<<((ostream *)this_00,"Pixel (");
            std::ostream::operator<<(this_00,iVar12);
            std::operator<<((ostream *)this_00,", ");
            std::ostream::operator<<(this_00,iVar19);
            std::operator<<((ostream *)this_00,"): Pixel invocations had only ");
            std::ostream::operator<<
                      (this_00,(int)masks._M_t._M_impl.super__Rb_tree_header._M_node_count);
            std::operator<<((ostream *)this_00," separate mask sets. Expected ");
            std::ostream::_M_insert<unsigned_long>((ulong)this_00);
            std::operator<<((ostream *)this_00," or more. Found masks:");
            tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage)
            ;
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
            for (p_Var13 = masks._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
                (_Rb_tree_header *)p_Var13 != &masks._M_t._M_impl.super__Rb_tree_header;
                p_Var13 = (_Base_ptr)std::_Rb_tree_increment(p_Var13)) {
              local_1b0.m_log =
                   ((this->super_SampleMaskBaseCase).super_MultisampleRenderCase.
                    super_MultisampleRenderCase.super_TestCase.super_TestCase.super_TestNode.
                   m_testCtx)->m_log;
              std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
              std::operator<<((ostream *)poVar1,"\tMask: ");
              hex.value._4_4_ = 0;
              hex.value._0_4_ = p_Var13[1]._M_color;
              tcu::Format::operator<<((ostream *)poVar1,hex);
              std::operator<<((ostream *)poVar1,"\n");
              tcu::MessageBuilder::operator<<
                        (&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
            }
            bVar9 = false;
          }
          else {
            bVar9 = false;
          }
        }
        std::
        _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
        ::~_Rb_tree(&masks._M_t);
      }
    }
    if (bVar9) {
LAB_004366cc:
      if (bVar14) goto LAB_00436765;
    }
    else if (5 < local_264) {
      local_1b0.m_log =
           ((this->super_SampleMaskBaseCase).super_MultisampleRenderCase.super_MultisampleRenderCase
            .super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log;
      poVar1 = &local_1b0.m_str;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
      std::operator<<((ostream *)poVar1,"...\n");
      std::operator<<((ostream *)poVar1,"Omitted ");
      std::ostream::operator<<(poVar1,local_264 + -5);
      std::operator<<((ostream *)poVar1," error descriptions.");
      tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      goto LAB_0043674a;
    }
  }
  tcu::TestContext::setTestResult
            ((this->super_SampleMaskBaseCase).super_MultisampleRenderCase.
             super_MultisampleRenderCase.super_TestCase.super_TestCase.super_TestNode.m_testCtx,
             QP_TEST_RESULT_FAIL,"Image verification failed");
LAB_00436765:
  tcu::ScopedLogSection::~ScopedLogSection(&section);
  std::vector<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_>::~vector(&sampleCoverage);
  return;
}

Assistant:

void SampleMaskUniqueSetCase::postTest (void)
{
	DE_ASSERT((m_iterationSampleBuffers.size() % 2) == 0);
	DE_ASSERT((int)m_iterationSampleBuffers.size() / 2 == m_numTargetSamples);

	const int						width			= m_iterationSampleBuffers[0].getWidth();
	const int						height			= m_iterationSampleBuffers[0].getHeight();
	bool							allOk			= true;
	std::vector<tcu::TextureLevel>	sampleCoverage	(m_numTargetSamples);
	const tcu::ScopedLogSection		section			(m_testCtx.getLog(), "Verify", "Verify masks");

	// convert color layers to 32 bit coverage masks, 2 passes per coverage

	for (int sampleNdx = 0; sampleNdx < (int)sampleCoverage.size(); ++sampleNdx)
	{
		sampleCoverage[sampleNdx].setStorage(tcu::TextureFormat(tcu::TextureFormat::R, tcu::TextureFormat::UNSIGNED_INT32), width, height);

		for (int y = 0; y < height; ++y)
		for (int x = 0; x < width; ++x)
		{
			const tcu::RGBA		lowColor	= m_iterationSampleBuffers[sampleNdx].getPixel(x, y);
			const tcu::RGBA		highColor	= m_iterationSampleBuffers[sampleNdx + (int)sampleCoverage.size()].getPixel(x, y);
			deUint16			low;
			deUint16			high;

			{
				int redBits		= (int)deFloatRound((float)lowColor.getRed() / 255.0f * 31);
				int greenBits	= (int)deFloatRound((float)lowColor.getGreen() / 255.0f * 63);
				int blueBits	= (int)deFloatRound((float)lowColor.getBlue() / 255.0f * 31);

				low = (deUint16)(redBits | (greenBits << 5) | (blueBits << 11));
			}
			{
				int redBits		= (int)deFloatRound((float)highColor.getRed() / 255.0f * 31);
				int greenBits	= (int)deFloatRound((float)highColor.getGreen() / 255.0f * 63);
				int blueBits	= (int)deFloatRound((float)highColor.getBlue() / 255.0f * 31);

				high = (deUint16)(redBits | (greenBits << 5) | (blueBits << 11));
			}

			sampleCoverage[sampleNdx].getAccess().setPixel(tcu::UVec4((((deUint32)high) << 16) | low, 0, 0, 0), x, y);
		}
	}

	// verify masks

	if (m_numRequestedSamples == 0)
	{
		// single sample target, expect mask = 0x01
		const int	printFloodLimit	= 5;
		int			printCount		= 0;

		m_testCtx.getLog() << tcu::TestLog::Message << "Verifying sample mask is 0x00000001." << tcu::TestLog::EndMessage;

		for (int y = 0; y < height; ++y)
		for (int x = 0; x < width; ++x)
		{
			deUint32 mask = sampleCoverage[0].getAccess().getPixelUint(x, y).x();
			if (mask != 0x01)
			{
				allOk = false;

				if (++printCount <= printFloodLimit)
				{
					m_testCtx.getLog()
						<< tcu::TestLog::Message
						<< "Pixel (" << x << ", " << y << "): Invalid mask, got " << tcu::Format::Hex<8>(mask) << ", expected " << tcu::Format::Hex<8>(0x01) << "\n"
						<< tcu::TestLog::EndMessage;
				}
			}
		}

		if (!allOk && printCount > printFloodLimit)
		{
			m_testCtx.getLog()
				<< tcu::TestLog::Message
				<< "...\n"
				<< "Omitted " << (printCount-printFloodLimit) << " error descriptions."
				<< tcu::TestLog::EndMessage;
		}
	}
	else
	{
		// check uniqueness
		{
			bool		uniquenessOk	= true;
			int			printCount		= 0;
			const int	printFloodLimit	= 5;

			m_testCtx.getLog() << tcu::TestLog::Message << "Verifying invocation sample masks do not share bits." << tcu::TestLog::EndMessage;

			for (int y = 0; y < height; ++y)
			for (int x = 0; x < width; ++x)
			{
				bool maskBitsNotUnique = false;

				for (int sampleNdxA = 0;            sampleNdxA < m_numTargetSamples && (!maskBitsNotUnique || printCount < printFloodLimit); ++sampleNdxA)
				for (int sampleNdxB = sampleNdxA+1; sampleNdxB < m_numTargetSamples && (!maskBitsNotUnique || printCount < printFloodLimit); ++sampleNdxB)
				{
					const deUint32 maskA = sampleCoverage[sampleNdxA].getAccess().getPixelUint(x, y).x();
					const deUint32 maskB = sampleCoverage[sampleNdxB].getAccess().getPixelUint(x, y).x();

					// equal mask == emitted by the same invocation
					if (maskA != maskB)
					{
						// shares samples?
						if (maskA & maskB)
						{
							maskBitsNotUnique = true;
							uniquenessOk = false;

							if (++printCount <= printFloodLimit)
							{
								m_testCtx.getLog()
									<< tcu::TestLog::Message
									<< "Pixel (" << x << ", " << y << "):\n"
									<< "\tSamples " << sampleNdxA << " and " << sampleNdxB << " share mask bits\n"
									<< "\tMask" << sampleNdxA << " = " << tcu::Format::Hex<8>(maskA) << "\n"
									<< "\tMask" << sampleNdxB << " = " << tcu::Format::Hex<8>(maskB) << "\n"
									<< tcu::TestLog::EndMessage;
							}
						}
					}
				}
			}

			if (!uniquenessOk)
			{
				allOk = false;

				if (printCount > printFloodLimit)
					m_testCtx.getLog()
						<< tcu::TestLog::Message
						<< "...\n"
						<< "Omitted " << (printCount-printFloodLimit) << " error descriptions."
						<< tcu::TestLog::EndMessage;
			}
		}

		// check number of sample mask bit groups is valid ( == number of invocations )
		{
			const deUint32			minNumInvocations	= (deUint32)de::max(1, (m_numTargetSamples+1)/2);
			bool					countOk				= true;
			int						printCount			= 0;
			const int				printFloodLimit		= 5;

			m_testCtx.getLog() << tcu::TestLog::Message << "Verifying cardinality of separate sample mask bit sets. Expecting equal to the number of invocations, (greater or equal to " << minNumInvocations << ")" << tcu::TestLog::EndMessage;

			for (int y = 0; y < height; ++y)
			for (int x = 0; x < width; ++x)
			{
				std::set<deUint32> masks;

				for (int maskNdx = 0; maskNdx < m_numTargetSamples; ++maskNdx)
				{
					const deUint32 mask = sampleCoverage[maskNdx].getAccess().getPixelUint(x, y).x();
					masks.insert(mask);
				}

				if ((int)masks.size() < (int)minNumInvocations)
				{
					if (++printCount <= printFloodLimit)
					{
						m_testCtx.getLog()
							<< tcu::TestLog::Message
							<< "Pixel (" << x << ", " << y << "): Pixel invocations had only " << (int)masks.size() << " separate mask sets. Expected " << minNumInvocations << " or more. Found masks:"
							<< tcu::TestLog::EndMessage;

						for (std::set<deUint32>::iterator it = masks.begin(); it != masks.end(); ++it)
							m_testCtx.getLog()
							<< tcu::TestLog::Message
							<< "\tMask: " << tcu::Format::Hex<8>(*it) << "\n"
							<< tcu::TestLog::EndMessage;
					}

					countOk = false;
				}
			}

			if (!countOk)
			{
				allOk = false;

				if (printCount > printFloodLimit)
					m_testCtx.getLog()
						<< tcu::TestLog::Message
						<< "...\n"
						<< "Omitted " << (printCount-printFloodLimit) << " error descriptions."
						<< tcu::TestLog::EndMessage;
			}
		}
	}

	if (!allOk)
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image verification failed");
}